

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O3

int vcf_format(bcf_hdr_t *h,bcf1_t *v,kstring_t *s)

{
  byte bVar1;
  int32_t iVar2;
  BGZF *fp;
  bool bVar3;
  uint uVar4;
  short sVar5;
  bool bVar6;
  byte bVar7;
  uint uVar8;
  size_t sVar9;
  ulong uVar10;
  char *pcVar11;
  ulong uVar12;
  char *pcVar13;
  byte *pbVar14;
  void *pvVar15;
  bool bVar16;
  uint uVar17;
  ulong uVar18;
  byte bVar19;
  ushort uVar20;
  ushort uVar21;
  ulong extraout_RDX;
  bcf_fmt_t *pbVar22;
  bcf_fmt_t *pbVar23;
  size_t __size;
  ulong *puVar24;
  bcf_hdr_t *pbVar25;
  char cVar26;
  size_t sVar27;
  int iVar28;
  long lVar29;
  ulong *puVar30;
  bcf_info_t *pbVar31;
  char buf [16];
  undefined8 local_60;
  byte local_58 [16];
  bcf_fmt_t *local_48;
  ulong local_40;
  ulong *local_38;
  
  bcf_unpack(v,0xf);
  pcVar13 = h->id[1][v->rid].key;
  local_60 = h;
  sVar9 = strlen(pcVar13);
  sVar27 = s->l;
  sVar9 = (size_t)(int)sVar9;
  uVar10 = sVar27 + sVar9 + 1;
  if (uVar10 < s->m) {
    pcVar11 = s->s;
LAB_0011b722:
    memcpy(pcVar11 + sVar27,pcVar13,sVar9);
    sVar27 = sVar9 + s->l;
    s->l = sVar27;
    s->s[sVar27] = '\0';
  }
  else {
    uVar10 = uVar10 >> 1 | uVar10;
    uVar10 = uVar10 >> 2 | uVar10;
    uVar10 = uVar10 >> 4 | uVar10;
    uVar10 = uVar10 >> 8 | uVar10;
    __size = (uVar10 >> 0x10 | uVar10) + 1;
    s->m = __size;
    pcVar11 = (char *)realloc(s->s,__size);
    if (pcVar11 != (char *)0x0) {
      s->s = pcVar11;
      sVar27 = s->l;
      goto LAB_0011b722;
    }
  }
  sVar27 = s->l;
  uVar10 = sVar27 + 1;
  if (uVar10 < s->m) {
    pcVar13 = s->s;
LAB_0011b7a3:
    s->l = uVar10;
    pcVar13[sVar27] = '\t';
    s->s[s->l] = '\0';
  }
  else {
    uVar10 = uVar10 >> 1 | uVar10;
    uVar10 = uVar10 >> 2 | uVar10;
    uVar10 = uVar10 >> 4 | uVar10;
    uVar10 = uVar10 >> 8 | uVar10;
    sVar9 = (uVar10 >> 0x10 | uVar10) + 1;
    s->m = sVar9;
    pcVar13 = (char *)realloc(s->s,sVar9);
    if (pcVar13 != (char *)0x0) {
      s->s = pcVar13;
      sVar27 = s->l;
      uVar10 = sVar27 + 1;
      goto LAB_0011b7a3;
    }
  }
  uVar8 = v->pos + 1;
  uVar17 = -uVar8;
  if (0 < (int)uVar8) {
    uVar17 = uVar8;
  }
  uVar10 = 0;
  do {
    local_58[uVar10] = (char)uVar17 + (char)(uVar17 / 10) * -10 | 0x30;
    uVar10 = uVar10 + 1;
    bVar16 = 9 < uVar17;
    uVar17 = uVar17 / 10;
  } while (bVar16);
  if ((int)uVar8 < 0) {
    uVar12 = uVar10 & 0xffffffff;
    uVar10 = (ulong)((int)uVar10 + 1);
    local_58[uVar12] = 0x2d;
  }
  uVar12 = s->l + (long)(int)uVar10 + 1;
  if (uVar12 < s->m) {
LAB_0011b85e:
    iVar28 = (int)uVar10 + 1;
    pbVar14 = local_58 + ((uVar10 & 0xffffffff) - 1);
    do {
      bVar7 = *pbVar14;
      sVar27 = s->l;
      s->l = sVar27 + 1;
      s->s[sVar27] = bVar7;
      iVar28 = iVar28 + -1;
      pbVar14 = pbVar14 + -1;
    } while (1 < iVar28);
    s->s[s->l] = '\0';
  }
  else {
    uVar12 = uVar12 >> 1 | uVar12;
    uVar12 = uVar12 >> 2 | uVar12;
    uVar12 = uVar12 >> 4 | uVar12;
    uVar12 = uVar12 >> 8 | uVar12;
    sVar9 = (uVar12 >> 0x10 | uVar12) + 1;
    s->m = sVar9;
    pcVar13 = (char *)realloc(s->s,sVar9);
    if (pcVar13 != (char *)0x0) {
      s->s = pcVar13;
      goto LAB_0011b85e;
    }
  }
  sVar27 = s->l;
  uVar10 = sVar27 + 1;
  if (uVar10 < s->m) {
    pcVar13 = s->s;
LAB_0011b8fd:
    s->l = uVar10;
    pcVar13[sVar27] = '\t';
    s->s[s->l] = '\0';
  }
  else {
    uVar10 = uVar10 >> 1 | uVar10;
    uVar10 = uVar10 >> 2 | uVar10;
    uVar10 = uVar10 >> 4 | uVar10;
    uVar10 = uVar10 >> 8 | uVar10;
    sVar9 = (uVar10 >> 0x10 | uVar10) + 1;
    s->m = sVar9;
    pcVar13 = (char *)realloc(s->s,sVar9);
    if (pcVar13 != (char *)0x0) {
      s->s = pcVar13;
      sVar27 = s->l;
      uVar10 = sVar27 + 1;
      goto LAB_0011b8fd;
    }
  }
  puVar24 = (ulong *)(v->d).id;
  puVar30 = (ulong *)0x156037;
  if (puVar24 != (ulong *)0x0) {
    puVar30 = puVar24;
  }
  sVar9 = strlen((char *)puVar30);
  sVar27 = s->l;
  sVar9 = (size_t)(int)sVar9;
  uVar10 = sVar27 + sVar9 + 1;
  if (uVar10 < s->m) {
    pcVar13 = s->s;
LAB_0011b98f:
    memcpy(pcVar13 + sVar27,puVar30,sVar9);
    sVar27 = sVar9 + s->l;
    s->l = sVar27;
    s->s[sVar27] = '\0';
    puVar24 = puVar30;
  }
  else {
    uVar10 = uVar10 >> 1 | uVar10;
    uVar10 = uVar10 >> 2 | uVar10;
    uVar10 = uVar10 >> 4 | uVar10;
    uVar10 = uVar10 >> 8 | uVar10;
    puVar24 = (ulong *)((uVar10 >> 0x10 | uVar10) + 1);
    s->m = (size_t)puVar24;
    pcVar13 = (char *)realloc(s->s,(size_t)puVar24);
    if (pcVar13 != (char *)0x0) {
      s->s = pcVar13;
      sVar27 = s->l;
      goto LAB_0011b98f;
    }
  }
  sVar27 = s->l;
  uVar10 = sVar27 + 1;
  if (uVar10 < s->m) {
    pcVar13 = s->s;
LAB_0011ba10:
    s->l = uVar10;
    pcVar13[sVar27] = '\t';
    s->s[s->l] = '\0';
  }
  else {
    uVar10 = uVar10 >> 1 | uVar10;
    uVar10 = uVar10 >> 2 | uVar10;
    uVar10 = uVar10 >> 4 | uVar10;
    uVar10 = uVar10 >> 8 | uVar10;
    puVar24 = (ulong *)((uVar10 >> 0x10 | uVar10) + 1);
    s->m = (size_t)puVar24;
    pcVar13 = (char *)realloc(s->s,(size_t)puVar24);
    if (pcVar13 != (char *)0x0) {
      s->s = pcVar13;
      sVar27 = s->l;
      uVar10 = sVar27 + 1;
      goto LAB_0011ba10;
    }
  }
  if (*(short *)&v->field_0x12 == 0) {
    sVar27 = s->l;
    uVar10 = sVar27 + 1;
    if (uVar10 < s->m) {
      pcVar13 = s->s;
    }
    else {
      uVar10 = uVar10 >> 1 | uVar10;
      uVar10 = uVar10 >> 2 | uVar10;
      uVar10 = uVar10 >> 4 | uVar10;
      uVar10 = uVar10 >> 8 | uVar10;
      puVar24 = (ulong *)((uVar10 >> 0x10 | uVar10) + 1);
      s->m = (size_t)puVar24;
      pcVar13 = (char *)realloc(s->s,(size_t)puVar24);
      if (pcVar13 == (char *)0x0) goto LAB_0011bb3a;
      s->s = pcVar13;
      sVar27 = s->l;
      uVar10 = sVar27 + 1;
    }
    s->l = uVar10;
    pcVar13[sVar27] = '.';
    pcVar13 = s->s + s->l;
LAB_0011bb35:
    *pcVar13 = '\0';
  }
  else {
    puVar30 = (ulong *)*(v->d).allele;
    sVar9 = strlen((char *)puVar30);
    sVar27 = s->l;
    sVar9 = (size_t)(int)sVar9;
    uVar10 = sVar27 + sVar9 + 1;
    if (uVar10 < s->m) {
      pcVar13 = s->s;
LAB_0011babc:
      memcpy(pcVar13 + sVar27,puVar30,sVar9);
      sVar27 = sVar9 + s->l;
      s->l = sVar27;
      pcVar13 = s->s + sVar27;
      puVar24 = puVar30;
      goto LAB_0011bb35;
    }
    uVar10 = uVar10 >> 1 | uVar10;
    uVar10 = uVar10 >> 2 | uVar10;
    uVar10 = uVar10 >> 4 | uVar10;
    uVar10 = uVar10 >> 8 | uVar10;
    puVar24 = (ulong *)((uVar10 >> 0x10 | uVar10) + 1);
    s->m = (size_t)puVar24;
    pcVar13 = (char *)realloc(s->s,(size_t)puVar24);
    if (pcVar13 != (char *)0x0) {
      s->s = pcVar13;
      sVar27 = s->l;
      goto LAB_0011babc;
    }
  }
LAB_0011bb3a:
  sVar27 = s->l;
  uVar10 = sVar27 + 1;
  if (uVar10 < s->m) {
    pcVar13 = s->s;
LAB_0011bb9e:
    s->l = uVar10;
    pcVar13[sVar27] = '\t';
    s->s[s->l] = '\0';
  }
  else {
    uVar10 = uVar10 >> 1 | uVar10;
    uVar10 = uVar10 >> 2 | uVar10;
    uVar10 = uVar10 >> 4 | uVar10;
    uVar10 = uVar10 >> 8 | uVar10;
    puVar24 = (ulong *)((uVar10 >> 0x10 | uVar10) + 1);
    s->m = (size_t)puVar24;
    pcVar13 = (char *)realloc(s->s,(size_t)puVar24);
    if (pcVar13 != (char *)0x0) {
      s->s = pcVar13;
      sVar27 = s->l;
      uVar10 = sVar27 + 1;
      goto LAB_0011bb9e;
    }
  }
  if ((*(ushort *)&v->field_0x12 & 0xfffe) == 0) {
    sVar27 = s->l;
    uVar10 = sVar27 + 1;
    if (uVar10 < s->m) {
      pcVar13 = s->s;
    }
    else {
      uVar10 = uVar10 >> 1 | uVar10;
      uVar10 = uVar10 >> 2 | uVar10;
      uVar10 = uVar10 >> 4 | uVar10;
      uVar10 = uVar10 >> 8 | uVar10;
      puVar24 = (ulong *)((uVar10 >> 0x10 | uVar10) + 1);
      s->m = (size_t)puVar24;
      pcVar13 = (char *)realloc(s->s,(size_t)puVar24);
      if (pcVar13 == (char *)0x0) goto LAB_0011bd61;
      s->s = pcVar13;
      sVar27 = s->l;
      uVar10 = sVar27 + 1;
    }
    s->l = uVar10;
    pcVar13[sVar27] = '.';
    s->s[s->l] = '\0';
  }
  else {
    uVar10 = 1;
    do {
      if (1 < uVar10) {
        sVar27 = s->l;
        uVar12 = sVar27 + 1;
        if (uVar12 < s->m) {
          pcVar13 = s->s;
        }
        else {
          uVar12 = uVar12 >> 1 | uVar12;
          uVar12 = uVar12 >> 2 | uVar12;
          uVar12 = uVar12 >> 4 | uVar12;
          uVar12 = uVar12 >> 8 | uVar12;
          sVar9 = (uVar12 >> 0x10 | uVar12) + 1;
          s->m = sVar9;
          pcVar13 = (char *)realloc(s->s,sVar9);
          if (pcVar13 == (char *)0x0) goto LAB_0011bc42;
          s->s = pcVar13;
          sVar27 = s->l;
          uVar12 = sVar27 + 1;
        }
        s->l = uVar12;
        pcVar13[sVar27] = ',';
        s->s[s->l] = '\0';
      }
LAB_0011bc42:
      puVar30 = (ulong *)(v->d).allele[uVar10];
      sVar9 = strlen((char *)puVar30);
      sVar27 = s->l;
      sVar9 = (size_t)(int)sVar9;
      uVar12 = sVar27 + sVar9 + 1;
      if (uVar12 < s->m) {
        pcVar13 = s->s;
LAB_0011bcbb:
        memcpy(pcVar13 + sVar27,puVar30,sVar9);
        sVar27 = sVar9 + s->l;
        s->l = sVar27;
        s->s[sVar27] = '\0';
        puVar24 = puVar30;
      }
      else {
        uVar12 = uVar12 >> 1 | uVar12;
        uVar12 = uVar12 >> 2 | uVar12;
        uVar12 = uVar12 >> 4 | uVar12;
        uVar12 = uVar12 >> 8 | uVar12;
        puVar24 = (ulong *)((uVar12 >> 0x10 | uVar12) + 1);
        s->m = (size_t)puVar24;
        pcVar13 = (char *)realloc(s->s,(size_t)puVar24);
        if (pcVar13 != (char *)0x0) {
          s->s = pcVar13;
          sVar27 = s->l;
          goto LAB_0011bcbb;
        }
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 < *(ushort *)&v->field_0x12);
  }
LAB_0011bd61:
  sVar27 = s->l;
  uVar10 = sVar27 + 1;
  if (uVar10 < s->m) {
    pcVar13 = s->s;
LAB_0011bdc5:
    s->l = uVar10;
    pcVar13[sVar27] = '\t';
    s->s[s->l] = '\0';
  }
  else {
    uVar10 = uVar10 >> 1 | uVar10;
    uVar10 = uVar10 >> 2 | uVar10;
    uVar10 = uVar10 >> 4 | uVar10;
    uVar10 = uVar10 >> 8 | uVar10;
    puVar24 = (ulong *)((uVar10 >> 0x10 | uVar10) + 1);
    s->m = (size_t)puVar24;
    pcVar13 = (char *)realloc(s->s,(size_t)puVar24);
    if (pcVar13 != (char *)0x0) {
      s->s = pcVar13;
      sVar27 = s->l;
      uVar10 = sVar27 + 1;
      goto LAB_0011bdc5;
    }
  }
  if ((float)bcf_float_missing == v->qual) {
    sVar27 = s->l;
    uVar10 = sVar27 + 1;
    if (uVar10 < s->m) {
      pcVar13 = s->s;
    }
    else {
      uVar10 = uVar10 >> 1 | uVar10;
      uVar10 = uVar10 >> 2 | uVar10;
      uVar10 = uVar10 >> 4 | uVar10;
      uVar10 = uVar10 >> 8 | uVar10;
      puVar24 = (ulong *)((uVar10 >> 0x10 | uVar10) + 1);
      s->m = (size_t)puVar24;
      pcVar13 = (char *)realloc(s->s,(size_t)puVar24);
      if (pcVar13 == (char *)0x0) goto LAB_0011be76;
      s->s = pcVar13;
      sVar27 = s->l;
      uVar10 = sVar27 + 1;
    }
    s->l = uVar10;
    pcVar13[sVar27] = '.';
    s->s[s->l] = '\0';
  }
  else {
    puVar24 = (ulong *)0x159550;
    ksprintf(s,"%g",(double)v->qual);
  }
LAB_0011be76:
  sVar27 = s->l;
  uVar10 = sVar27 + 1;
  if (uVar10 < s->m) {
    pcVar13 = s->s;
LAB_0011beda:
    s->l = uVar10;
    pcVar13[sVar27] = '\t';
    s->s[s->l] = '\0';
  }
  else {
    uVar10 = uVar10 >> 1 | uVar10;
    uVar10 = uVar10 >> 2 | uVar10;
    uVar10 = uVar10 >> 4 | uVar10;
    uVar10 = uVar10 >> 8 | uVar10;
    puVar24 = (ulong *)((uVar10 >> 0x10 | uVar10) + 1);
    s->m = (size_t)puVar24;
    pcVar13 = (char *)realloc(s->s,(size_t)puVar24);
    if (pcVar13 != (char *)0x0) {
      s->s = pcVar13;
      sVar27 = s->l;
      uVar10 = sVar27 + 1;
      goto LAB_0011beda;
    }
  }
  iVar28 = (v->d).n_flt;
  if (iVar28 == 0) {
    sVar27 = s->l;
    uVar10 = sVar27 + 1;
    if (uVar10 < s->m) {
      pcVar13 = s->s;
    }
    else {
      uVar10 = uVar10 >> 1 | uVar10;
      uVar10 = uVar10 >> 2 | uVar10;
      uVar10 = uVar10 >> 4 | uVar10;
      uVar10 = uVar10 >> 8 | uVar10;
      puVar24 = (ulong *)((uVar10 >> 0x10 | uVar10) + 1);
      s->m = (size_t)puVar24;
      pcVar13 = (char *)realloc(s->s,(size_t)puVar24);
      if (pcVar13 == (char *)0x0) goto LAB_0011c0a7;
      s->s = pcVar13;
      sVar27 = s->l;
      uVar10 = sVar27 + 1;
    }
    s->l = uVar10;
    pcVar13[sVar27] = '.';
    s->s[s->l] = '\0';
  }
  else if (0 < iVar28) {
    lVar29 = 0;
    do {
      if (lVar29 != 0) {
        sVar27 = s->l;
        uVar10 = sVar27 + 1;
        if (uVar10 < s->m) {
          pcVar13 = s->s;
        }
        else {
          uVar10 = uVar10 >> 1 | uVar10;
          uVar10 = uVar10 >> 2 | uVar10;
          uVar10 = uVar10 >> 4 | uVar10;
          uVar10 = uVar10 >> 8 | uVar10;
          sVar9 = (uVar10 >> 0x10 | uVar10) + 1;
          s->m = sVar9;
          pcVar13 = (char *)realloc(s->s,sVar9);
          if (pcVar13 == (char *)0x0) goto LAB_0011bf7b;
          s->s = pcVar13;
          sVar27 = s->l;
          uVar10 = sVar27 + 1;
        }
        s->l = uVar10;
        pcVar13[sVar27] = ';';
        s->s[s->l] = '\0';
      }
LAB_0011bf7b:
      puVar30 = (ulong *)local_60->id[0][(v->d).flt[lVar29]].key;
      sVar9 = strlen((char *)puVar30);
      sVar27 = s->l;
      sVar9 = (size_t)(int)sVar9;
      uVar10 = sVar27 + sVar9 + 1;
      if (uVar10 < s->m) {
        pcVar13 = s->s;
LAB_0011c002:
        memcpy(pcVar13 + sVar27,puVar30,sVar9);
        sVar27 = sVar9 + s->l;
        s->l = sVar27;
        s->s[sVar27] = '\0';
        puVar24 = puVar30;
      }
      else {
        uVar10 = uVar10 >> 1 | uVar10;
        uVar10 = uVar10 >> 2 | uVar10;
        uVar10 = uVar10 >> 4 | uVar10;
        uVar10 = uVar10 >> 8 | uVar10;
        puVar24 = (ulong *)((uVar10 >> 0x10 | uVar10) + 1);
        s->m = (size_t)puVar24;
        pcVar13 = (char *)realloc(s->s,(size_t)puVar24);
        if (pcVar13 != (char *)0x0) {
          s->s = pcVar13;
          sVar27 = s->l;
          goto LAB_0011c002;
        }
      }
      lVar29 = lVar29 + 1;
    } while (lVar29 < (v->d).n_flt);
  }
LAB_0011c0a7:
  sVar27 = s->l;
  uVar10 = sVar27 + 1;
  if (uVar10 < s->m) {
    pcVar13 = s->s;
LAB_0011c10b:
    s->l = uVar10;
    pcVar13[sVar27] = '\t';
    s->s[s->l] = '\0';
  }
  else {
    uVar10 = uVar10 >> 1 | uVar10;
    uVar10 = uVar10 >> 2 | uVar10;
    uVar10 = uVar10 >> 4 | uVar10;
    uVar10 = uVar10 >> 8 | uVar10;
    puVar24 = (ulong *)((uVar10 >> 0x10 | uVar10) + 1);
    s->m = (size_t)puVar24;
    pcVar13 = (char *)realloc(s->s,(size_t)puVar24);
    if (pcVar13 != (char *)0x0) {
      s->s = pcVar13;
      sVar27 = s->l;
      uVar10 = sVar27 + 1;
      goto LAB_0011c10b;
    }
  }
  if (*(short *)&v->field_0x10 == 0) {
    sVar27 = s->l;
    uVar10 = sVar27 + 1;
    if (uVar10 < s->m) {
      pcVar13 = s->s;
    }
    else {
      uVar10 = uVar10 >> 1 | uVar10;
      uVar10 = uVar10 >> 2 | uVar10;
      uVar10 = uVar10 >> 4 | uVar10;
      uVar10 = uVar10 >> 8 | uVar10;
      puVar24 = (ulong *)((uVar10 >> 0x10 | uVar10) + 1);
      s->m = (size_t)puVar24;
      pcVar13 = (char *)realloc(s->s,(size_t)puVar24);
      if (pcVar13 == (char *)0x0) goto LAB_0011c7ee;
LAB_0011c7cf:
      s->s = pcVar13;
      sVar27 = s->l;
      uVar10 = sVar27 + 1;
    }
LAB_0011c7da:
    s->l = uVar10;
    pcVar13[sVar27] = '.';
    s->s[s->l] = '\0';
  }
  else {
    bVar16 = true;
    uVar10 = 0;
    do {
      pbVar31 = (v->d).info;
      if (pbVar31[uVar10].vptr != (uint8_t *)0x0) {
        if (!bVar16) {
          sVar27 = s->l;
          uVar12 = sVar27 + 1;
          if (uVar12 < s->m) {
            pcVar13 = s->s;
          }
          else {
            uVar12 = uVar12 >> 1 | uVar12;
            uVar12 = uVar12 >> 2 | uVar12;
            uVar12 = uVar12 >> 4 | uVar12;
            uVar12 = uVar12 >> 8 | uVar12;
            sVar9 = (uVar12 >> 0x10 | uVar12) + 1;
            s->m = sVar9;
            pcVar13 = (char *)realloc(s->s,sVar9);
            if (pcVar13 == (char *)0x0) goto LAB_0011c1cf;
            s->s = pcVar13;
            sVar27 = s->l;
            uVar12 = sVar27 + 1;
          }
          s->l = uVar12;
          pcVar13[sVar27] = ';';
          s->s[s->l] = '\0';
        }
LAB_0011c1cf:
        pbVar31 = pbVar31 + uVar10;
        puVar30 = (ulong *)local_60->id[0][pbVar31->key].key;
        sVar9 = strlen((char *)puVar30);
        sVar27 = s->l;
        sVar9 = (size_t)(int)sVar9;
        uVar12 = sVar27 + sVar9 + 1;
        if (uVar12 < s->m) {
          pcVar13 = s->s;
LAB_0011c254:
          memcpy(pcVar13 + sVar27,puVar30,sVar9);
          sVar27 = sVar9 + s->l;
          s->l = sVar27;
          s->s[sVar27] = '\0';
          puVar24 = puVar30;
        }
        else {
          uVar12 = uVar12 >> 1 | uVar12;
          uVar12 = uVar12 >> 2 | uVar12;
          uVar12 = uVar12 >> 4 | uVar12;
          uVar12 = uVar12 >> 8 | uVar12;
          puVar24 = (ulong *)((uVar12 >> 0x10 | uVar12) + 1);
          s->m = (size_t)puVar24;
          pcVar13 = (char *)realloc(s->s,(size_t)puVar24);
          if (pcVar13 != (char *)0x0) {
            s->s = pcVar13;
            sVar27 = s->l;
            goto LAB_0011c254;
          }
        }
        bVar6 = false;
        bVar3 = false;
        bVar16 = bVar6;
        if (0 < pbVar31->len) {
          sVar27 = s->l;
          uVar12 = sVar27 + 1;
          if (uVar12 < s->m) {
            pcVar13 = s->s;
LAB_0011c2e1:
            s->l = uVar12;
            pcVar13[sVar27] = '=';
            s->s[s->l] = '\0';
          }
          else {
            uVar12 = uVar12 >> 1 | uVar12;
            uVar12 = uVar12 >> 2 | uVar12;
            uVar12 = uVar12 >> 4 | uVar12;
            uVar12 = uVar12 >> 8 | uVar12;
            sVar9 = (uVar12 >> 0x10 | uVar12) + 1;
            s->m = sVar9;
            pcVar13 = (char *)realloc(s->s,sVar9);
            if (pcVar13 != (char *)0x0) {
              s->s = pcVar13;
              sVar27 = s->l;
              uVar12 = sVar27 + 1;
              goto LAB_0011c2e1;
            }
          }
          uVar17 = pbVar31->type;
          uVar12 = (ulong)uVar17;
          uVar8 = pbVar31->len;
          puVar24 = (ulong *)(ulong)uVar8;
          if (uVar8 == 1) {
            bVar16 = bVar3;
            switch(uVar17) {
            case 1:
              uVar17 = (pbVar31->v1).i;
              if (uVar17 == 0xffffff80) {
LAB_0011c545:
                sVar27 = s->l;
                uVar12 = sVar27 + 1;
                if (uVar12 < s->m) {
                  pcVar13 = s->s;
                }
                else {
                  uVar12 = uVar12 >> 1 | uVar12;
                  uVar12 = uVar12 >> 2 | uVar12;
                  uVar12 = uVar12 >> 4 | uVar12;
                  uVar12 = uVar12 >> 8 | uVar12;
                  puVar24 = (ulong *)((uVar12 >> 0x10 | uVar12) + 1);
                  s->m = (size_t)puVar24;
                  pcVar13 = (char *)realloc(s->s,(size_t)puVar24);
                  if (pcVar13 == (char *)0x0) goto LAB_0011c6ee;
                  s->s = pcVar13;
                  sVar27 = s->l;
                  uVar12 = sVar27 + 1;
                }
                s->l = uVar12;
                pcVar13[sVar27] = '.';
              }
              else {
                uVar8 = -uVar17;
                if (0 < (int)uVar17) {
                  uVar8 = uVar17;
                }
                uVar12 = 0;
                do {
                  local_58[uVar12] = (char)uVar8 + (char)(uVar8 / 10) * -10 | 0x30;
                  uVar12 = uVar12 + 1;
                  bVar3 = 9 < uVar8;
                  uVar8 = uVar8 / 10;
                } while (bVar3);
                if ((int)uVar17 < 0) {
                  uVar18 = uVar12 & 0xffffffff;
                  uVar12 = (ulong)((int)uVar12 + 1);
                  local_58[uVar18] = 0x2d;
                }
                uVar18 = s->l + (long)(int)uVar12 + 1;
                if (s->m <= uVar18) {
                  uVar18 = uVar18 >> 1 | uVar18;
                  uVar18 = uVar18 >> 2 | uVar18;
                  uVar18 = uVar18 >> 4 | uVar18;
                  uVar18 = uVar18 >> 8 | uVar18;
                  puVar24 = (ulong *)((uVar18 >> 0x10 | uVar18) + 1);
                  s->m = (size_t)puVar24;
                  pcVar13 = (char *)realloc(s->s,(size_t)puVar24);
                  if (pcVar13 == (char *)0x0) goto LAB_0011c6ee;
                  s->s = pcVar13;
                }
                iVar28 = (int)uVar12 + 1;
                pbVar14 = local_58 + ((uVar12 & 0xffffffff) - 1);
                do {
                  bVar7 = *pbVar14;
                  sVar27 = s->l;
                  puVar24 = (ulong *)s->s;
                  s->l = sVar27 + 1;
                  *(byte *)((long)puVar24 + sVar27) = bVar7;
                  iVar28 = iVar28 + -1;
                  pbVar14 = pbVar14 + -1;
                } while (1 < iVar28);
              }
              break;
            case 2:
              uVar17 = (pbVar31->v1).i;
              if (uVar17 == 0xffff8000) goto LAB_0011c545;
              uVar8 = -uVar17;
              if (0 < (int)uVar17) {
                uVar8 = uVar17;
              }
              uVar12 = 0;
              do {
                local_58[uVar12] = (char)uVar8 + (char)(uVar8 / 10) * -10 | 0x30;
                uVar12 = uVar12 + 1;
                bVar3 = 9 < uVar8;
                uVar8 = uVar8 / 10;
              } while (bVar3);
              if ((int)uVar17 < 0) {
                uVar18 = uVar12 & 0xffffffff;
                uVar12 = (ulong)((int)uVar12 + 1);
                local_58[uVar18] = 0x2d;
              }
              uVar18 = s->l + (long)(int)uVar12 + 1;
              if (s->m <= uVar18) {
                uVar18 = uVar18 >> 1 | uVar18;
                uVar18 = uVar18 >> 2 | uVar18;
                uVar18 = uVar18 >> 4 | uVar18;
                uVar18 = uVar18 >> 8 | uVar18;
                puVar24 = (ulong *)((uVar18 >> 0x10 | uVar18) + 1);
                s->m = (size_t)puVar24;
                pcVar13 = (char *)realloc(s->s,(size_t)puVar24);
                if (pcVar13 == (char *)0x0) goto LAB_0011c6ee;
                s->s = pcVar13;
              }
              iVar28 = (int)uVar12 + 1;
              pbVar14 = local_58 + ((uVar12 & 0xffffffff) - 1);
              do {
                bVar7 = *pbVar14;
                sVar27 = s->l;
                puVar24 = (ulong *)s->s;
                s->l = sVar27 + 1;
                *(byte *)((long)puVar24 + sVar27) = bVar7;
                iVar28 = iVar28 + -1;
                pbVar14 = pbVar14 + -1;
              } while (1 < iVar28);
              break;
            case 3:
              uVar17 = (pbVar31->v1).i;
              uVar8 = -uVar17;
              if (0 < (int)uVar17) {
                uVar8 = uVar17;
              }
              uVar12 = 0;
              do {
                local_58[uVar12] = (char)uVar8 + (char)(uVar8 / 10) * -10 | 0x30;
                uVar12 = uVar12 + 1;
                bVar3 = 9 < uVar8;
                uVar8 = uVar8 / 10;
              } while (bVar3);
              if ((int)uVar17 < 0) {
                uVar18 = uVar12 & 0xffffffff;
                uVar12 = (ulong)((int)uVar12 + 1);
                local_58[uVar18] = 0x2d;
              }
              uVar18 = s->l + (long)(int)uVar12 + 1;
              if (s->m <= uVar18) {
                uVar18 = uVar18 >> 1 | uVar18;
                uVar18 = uVar18 >> 2 | uVar18;
                uVar18 = uVar18 >> 4 | uVar18;
                uVar18 = uVar18 >> 8 | uVar18;
                puVar24 = (ulong *)((uVar18 >> 0x10 | uVar18) + 1);
                s->m = (size_t)puVar24;
                pcVar13 = (char *)realloc(s->s,(size_t)puVar24);
                if (pcVar13 == (char *)0x0) goto LAB_0011c6ee;
                s->s = pcVar13;
              }
              iVar28 = (int)uVar12 + 1;
              pbVar14 = local_58 + ((uVar12 & 0xffffffff) - 1);
              do {
                bVar7 = *pbVar14;
                sVar27 = s->l;
                puVar24 = (ulong *)s->s;
                s->l = sVar27 + 1;
                *(byte *)((long)puVar24 + sVar27) = bVar7;
                iVar28 = iVar28 + -1;
                pbVar14 = pbVar14 + -1;
              } while (1 < iVar28);
              break;
            default:
              goto switchD_0011c31e_caseD_4;
            case 5:
              if ((float)bcf_float_missing == (pbVar31->v1).f) goto LAB_0011c545;
              puVar24 = (ulong *)0x159550;
              ksprintf(s,"%g",(double)(pbVar31->v1).f);
              goto LAB_0011c6ee;
            case 7:
              iVar2 = (pbVar31->v1).i;
              sVar27 = s->l;
              uVar12 = sVar27 + 1;
              if (uVar12 < s->m) {
                pcVar13 = s->s;
              }
              else {
                uVar12 = uVar12 >> 1 | uVar12;
                uVar12 = uVar12 >> 2 | uVar12;
                uVar12 = uVar12 >> 4 | uVar12;
                uVar12 = uVar12 >> 8 | uVar12;
                puVar24 = (ulong *)((uVar12 >> 0x10 | uVar12) + 1);
                s->m = (size_t)puVar24;
                pcVar13 = (char *)realloc(s->s,(size_t)puVar24);
                if (pcVar13 == (char *)0x0) goto LAB_0011c6ee;
                s->s = pcVar13;
                sVar27 = s->l;
                uVar12 = sVar27 + 1;
              }
              s->l = uVar12;
              pcVar13[sVar27] = (char)iVar2;
            }
            s->s[s->l] = '\0';
            bVar16 = bVar6;
          }
          else {
            bcf_fmt_array(s,uVar8,uVar17,pbVar31->vptr);
          }
        }
      }
LAB_0011c6ee:
      uVar10 = uVar10 + 1;
      uVar12 = *(ulong *)&v->field_0x10;
    } while (uVar10 < (uVar12 & 0xffff));
    if (!bVar16) goto LAB_0011c7f2;
    sVar27 = s->l;
    uVar10 = sVar27 + 1;
    if (uVar10 < s->m) {
      pcVar13 = s->s;
      goto LAB_0011c7da;
    }
    uVar10 = uVar10 >> 1 | uVar10;
    uVar10 = uVar10 >> 2 | uVar10;
    uVar10 = uVar10 >> 4 | uVar10;
    uVar10 = uVar10 >> 8 | uVar10;
    puVar24 = (ulong *)((uVar10 >> 0x10 | uVar10) + 1);
    s->m = (size_t)puVar24;
    pcVar13 = (char *)realloc(s->s,(size_t)puVar24);
    if (pcVar13 != (char *)0x0) goto LAB_0011c7cf;
  }
LAB_0011c7ee:
  uVar12 = *(ulong *)&v->field_0x10;
LAB_0011c7f2:
  if (uVar12 >> 0x28 != 0) {
    if ((uVar12 & 0xff00000000) == 0) {
      uVar17 = 0xffffffff;
      do {
        sVar27 = s->l;
        uVar10 = sVar27 + 3;
        if (uVar10 < s->m) {
          pcVar13 = s->s;
LAB_0011ca8c:
          (pcVar13 + sVar27)[0] = '\t';
          (pcVar13 + sVar27)[1] = '.';
          sVar27 = s->l;
          s->l = sVar27 + 2;
          s->s[sVar27 + 2] = '\0';
        }
        else {
          uVar10 = uVar10 >> 1 | uVar10;
          uVar10 = uVar10 >> 2 | uVar10;
          uVar10 = uVar10 >> 4 | uVar10;
          uVar10 = uVar10 >> 8 | uVar10;
          sVar9 = (uVar10 >> 0x10 | uVar10) + 1;
          s->m = sVar9;
          pcVar13 = (char *)realloc(s->s,sVar9);
          if (pcVar13 != (char *)0x0) {
            s->s = pcVar13;
            sVar27 = s->l;
            goto LAB_0011ca8c;
          }
        }
        uVar17 = uVar17 + 1;
      } while (uVar17 < (uint)((ulong)*(undefined8 *)&v->field_0x10 >> 0x28));
    }
    else {
      puVar30 = (ulong *)0xffffffff;
      cVar26 = '\t';
      uVar10 = 0;
      bVar16 = false;
      local_48 = (v->d).fmt;
      do {
        pbVar23 = local_48;
        pbVar22 = local_48 + uVar10;
        while (pbVar22->p == (uint8_t *)0x0) {
          uVar10 = uVar10 + 1;
          pbVar22 = pbVar22 + 1;
          if ((uVar12 >> 0x20 & 0xff) <= uVar10) {
            if (!bVar16) {
              sVar27 = s->l;
              uVar10 = sVar27 + 3;
              if (uVar10 < s->m) {
                pcVar13 = s->s;
              }
              else {
                uVar10 = uVar10 >> 1 | uVar10;
                uVar10 = uVar10 >> 2 | uVar10;
                uVar10 = uVar10 >> 4 | uVar10;
                uVar10 = uVar10 >> 8 | uVar10;
                puVar24 = (ulong *)((uVar10 >> 0x10 | uVar10) + 1);
                s->m = (size_t)puVar24;
                pcVar13 = (char *)realloc(s->s,(size_t)puVar24);
                if (pcVar13 == (char *)0x0) goto LAB_0011cb26;
                s->s = pcVar13;
                sVar27 = s->l;
              }
              (pcVar13 + sVar27)[0] = '\t';
              (pcVar13 + sVar27)[1] = '.';
              sVar27 = s->l;
              s->l = sVar27 + 2;
              s->s[sVar27 + 2] = '\0';
            }
LAB_0011cb26:
            uVar12 = *(ulong *)&v->field_0x10;
            goto LAB_0011cb2a;
          }
        }
        sVar27 = s->l;
        uVar12 = sVar27 + 1;
        if (uVar12 < s->m) {
          pcVar13 = s->s;
LAB_0011c8ca:
          s->l = uVar12;
          pcVar13[sVar27] = cVar26;
          s->s[s->l] = '\0';
        }
        else {
          uVar12 = uVar12 >> 1 | uVar12;
          uVar12 = uVar12 >> 2 | uVar12;
          uVar12 = uVar12 >> 4 | uVar12;
          uVar12 = uVar12 >> 8 | uVar12;
          puVar24 = (ulong *)((uVar12 >> 0x10 | uVar12) + 1);
          s->m = (size_t)puVar24;
          pcVar13 = (char *)realloc(s->s,(size_t)puVar24);
          if (pcVar13 != (char *)0x0) {
            s->s = pcVar13;
            sVar27 = s->l;
            uVar12 = sVar27 + 1;
            goto LAB_0011c8ca;
          }
        }
        uVar12 = (ulong)pbVar22->id;
        if ((long)uVar12 < 0) goto LAB_0011d5db;
        local_38 = (ulong *)local_60->id[0][uVar12].key;
        sVar9 = strlen((char *)local_38);
        sVar27 = s->l;
        sVar9 = (size_t)(int)sVar9;
        uVar12 = sVar27 + sVar9 + 1;
        if (uVar12 < s->m) {
          pcVar13 = s->s;
LAB_0011c970:
          puVar24 = local_38;
          memcpy(pcVar13 + sVar27,local_38,sVar9);
          sVar27 = sVar9 + s->l;
          s->l = sVar27;
          s->s[sVar27] = '\0';
        }
        else {
          uVar12 = uVar12 >> 1 | uVar12;
          uVar12 = uVar12 >> 2 | uVar12;
          uVar12 = uVar12 >> 4 | uVar12;
          uVar12 = uVar12 >> 8 | uVar12;
          puVar24 = (ulong *)((uVar12 >> 0x10 | uVar12) + 1);
          s->m = (size_t)puVar24;
          pcVar13 = (char *)realloc(s->s,(size_t)puVar24);
          if (pcVar13 != (char *)0x0) {
            s->s = pcVar13;
            sVar27 = s->l;
            goto LAB_0011c970;
          }
        }
        pcVar13 = local_60->id[0][pbVar22->id].key;
        if (((*pcVar13 == 'G') && (pcVar13[1] == 'T')) && (pcVar13[2] == '\0')) {
          puVar30 = (ulong *)(uVar10 & 0xffffffff);
        }
        uVar12 = *(ulong *)&v->field_0x10;
        uVar10 = uVar10 + 1;
        bVar16 = true;
        cVar26 = ':';
        pbVar23 = local_48;
      } while (uVar10 < (uVar12 >> 0x20 & 0xff));
LAB_0011cb2a:
      if (0xffffffffff < uVar12) {
        local_38 = puVar30;
        local_40 = 0;
LAB_0011cb4a:
        sVar27 = s->l;
        uVar10 = sVar27 + 1;
        if (uVar10 < s->m) {
          pcVar13 = s->s;
LAB_0011cbb6:
          s->l = uVar10;
          pcVar13[sVar27] = '\t';
          s->s[s->l] = '\0';
        }
        else {
          uVar10 = uVar10 >> 1 | uVar10;
          uVar10 = uVar10 >> 2 | uVar10;
          uVar10 = uVar10 >> 4 | uVar10;
          uVar10 = uVar10 >> 8 | uVar10;
          puVar24 = (ulong *)((uVar10 >> 0x10 | uVar10) + 1);
          s->m = (size_t)puVar24;
          pcVar13 = (char *)realloc(s->s,(size_t)puVar24);
          if (pcVar13 != (char *)0x0) {
            s->s = pcVar13;
            sVar27 = s->l;
            uVar10 = sVar27 + 1;
            goto LAB_0011cbb6;
          }
        }
        if ((*(ulong *)&v->field_0x10 & 0xff00000000) != 0) {
          bVar16 = true;
          puVar30 = (ulong *)0x0;
LAB_0011cbe4:
          if (pbVar23[(long)puVar30].p == (uint8_t *)0x0) goto LAB_0011d4a1;
          if (!bVar16) {
            sVar27 = s->l;
            uVar10 = sVar27 + 1;
            if (uVar10 < s->m) {
              pcVar13 = s->s;
            }
            else {
              uVar10 = uVar10 >> 1 | uVar10;
              uVar10 = uVar10 >> 2 | uVar10;
              uVar10 = uVar10 >> 4 | uVar10;
              uVar10 = uVar10 >> 8 | uVar10;
              puVar24 = (ulong *)((uVar10 >> 0x10 | uVar10) + 1);
              s->m = (size_t)puVar24;
              pcVar13 = (char *)realloc(s->s,(size_t)puVar24);
              if (pcVar13 == (char *)0x0) goto LAB_0011cc71;
              s->s = pcVar13;
              sVar27 = s->l;
              uVar10 = sVar27 + 1;
            }
            s->l = uVar10;
            pcVar13[sVar27] = ':';
            s->s[s->l] = '\0';
          }
LAB_0011cc71:
          if (puVar30 != local_38) {
            puVar24 = (ulong *)(ulong)(uint)pbVar23[(long)puVar30].n;
            bcf_fmt_array(s,pbVar23[(long)puVar30].n,pbVar23[(long)puVar30].type,
                          pbVar23[(long)puVar30].p +
                          (long)(int)local_40 * (long)pbVar23[(long)puVar30].size);
            goto LAB_0011d49f;
          }
          iVar28 = pbVar23[(long)puVar30].type;
          if (iVar28 == 3) {
            if (0 < pbVar23[(long)puVar30].n) {
              pbVar25 = (bcf_hdr_t *)
                        (pbVar23[(long)puVar30].p +
                        (long)(int)local_40 * (long)pbVar23[(long)puVar30].size);
              lVar29 = 0;
              local_60 = pbVar25;
              do {
                uVar17 = pbVar25->n[lVar29];
                if (uVar17 == 0x80000001) goto LAB_0011d39b;
                if (lVar29 != 0) {
                  cVar26 = "/|"[uVar17 & 1];
                  sVar27 = s->l;
                  uVar10 = sVar27 + 1;
                  if (uVar10 < s->m) {
                    pcVar13 = s->s;
LAB_0011d205:
                    s->l = uVar10;
                    pcVar13[sVar27] = cVar26;
                    s->s[s->l] = '\0';
                  }
                  else {
                    uVar10 = uVar10 >> 1 | uVar10;
                    uVar10 = uVar10 >> 2 | uVar10;
                    uVar10 = uVar10 >> 4 | uVar10;
                    uVar10 = uVar10 >> 8 | uVar10;
                    puVar24 = (ulong *)((uVar10 >> 0x10 | uVar10) + 1);
                    s->m = (size_t)puVar24;
                    pcVar13 = (char *)realloc(s->s,(size_t)puVar24);
                    pbVar25 = local_60;
                    if (pcVar13 != (char *)0x0) {
                      s->s = pcVar13;
                      sVar27 = s->l;
                      uVar10 = sVar27 + 1;
                      goto LAB_0011d205;
                    }
                  }
                  uVar17 = pbVar25->n[lVar29];
                }
                if (uVar17 < 2) {
                  sVar27 = s->l;
                  uVar10 = sVar27 + 1;
                  if (uVar10 < s->m) {
                    pcVar13 = s->s;
LAB_0011d369:
                    s->l = uVar10;
                    pcVar13[sVar27] = '.';
                    goto LAB_0011d370;
                  }
                  uVar10 = uVar10 >> 1 | uVar10;
                  uVar10 = uVar10 >> 2 | uVar10;
                  uVar10 = uVar10 >> 4 | uVar10;
                  uVar10 = uVar10 >> 8 | uVar10;
                  puVar24 = (ulong *)((uVar10 >> 0x10 | uVar10) + 1);
                  s->m = (size_t)puVar24;
                  pcVar13 = (char *)realloc(s->s,(size_t)puVar24);
                  pbVar25 = local_60;
                  if (pcVar13 != (char *)0x0) {
                    s->s = pcVar13;
                    sVar27 = s->l;
                    uVar10 = sVar27 + 1;
                    goto LAB_0011d369;
                  }
                }
                else {
                  uVar8 = ((int)uVar17 >> 1) - 1;
                  uVar4 = -uVar8;
                  if (0 < (int)uVar8) {
                    uVar4 = uVar8;
                  }
                  uVar10 = 0;
                  do {
                    local_58[uVar10] = (char)uVar4 + (char)(uVar4 / 10) * -10 | 0x30;
                    uVar10 = uVar10 + 1;
                    bVar16 = 9 < uVar4;
                    uVar4 = uVar4 / 10;
                  } while (bVar16);
                  if ((int)uVar17 >> 1 < 1) {
                    uVar12 = uVar10 & 0xffffffff;
                    uVar10 = (ulong)((int)uVar10 + 1);
                    local_58[uVar12] = 0x2d;
                  }
                  uVar12 = s->l + (long)(int)uVar10 + 1;
                  if (s->m <= uVar12) {
                    uVar12 = uVar12 >> 1 | uVar12;
                    uVar12 = uVar12 >> 2 | uVar12;
                    uVar12 = uVar12 >> 4 | uVar12;
                    uVar12 = uVar12 >> 8 | uVar12;
                    puVar24 = (ulong *)((uVar12 >> 0x10 | uVar12) + 1);
                    s->m = (size_t)puVar24;
                    pcVar13 = (char *)realloc(s->s,(size_t)puVar24);
                    pbVar25 = local_60;
                    if (pcVar13 == (char *)0x0) goto LAB_0011d37b;
                    s->s = pcVar13;
                  }
                  iVar28 = (int)uVar10 + 1;
                  pbVar14 = local_58 + ((uVar10 & 0xffffffff) - 1);
                  do {
                    bVar7 = *pbVar14;
                    sVar27 = s->l;
                    puVar24 = (ulong *)s->s;
                    s->l = sVar27 + 1;
                    *(byte *)((long)puVar24 + sVar27) = bVar7;
                    iVar28 = iVar28 + -1;
                    pbVar14 = pbVar14 + -1;
                  } while (1 < iVar28);
LAB_0011d370:
                  s->s[s->l] = '\0';
                }
LAB_0011d37b:
                lVar29 = lVar29 + 1;
              } while (lVar29 < pbVar23[(long)puVar30].n);
              goto LAB_0011d38b;
            }
            goto LAB_0011d3b0;
          }
          if (iVar28 == 2) {
            if (0 < pbVar23[(long)puVar30].n) {
              pbVar25 = (bcf_hdr_t *)
                        (pbVar23[(long)puVar30].p +
                        (long)(int)local_40 * (long)pbVar23[(long)puVar30].size);
              lVar29 = 0;
              local_60 = pbVar25;
              do {
                uVar21 = *(ushort *)((long)pbVar25->n + lVar29 * 2);
                if (uVar21 == 0x8001) {
                  pbVar23 = local_48;
                  if (lVar29 == 0) goto LAB_0011d427;
                  goto LAB_0011d49f;
                }
                if (lVar29 != 0) {
                  cVar26 = "/|"[uVar21 & 1];
                  sVar27 = s->l;
                  uVar10 = sVar27 + 1;
                  if (uVar10 < s->m) {
                    pcVar13 = s->s;
LAB_0011cfbb:
                    s->l = uVar10;
                    pcVar13[sVar27] = cVar26;
                    s->s[s->l] = '\0';
                  }
                  else {
                    uVar10 = uVar10 >> 1 | uVar10;
                    uVar10 = uVar10 >> 2 | uVar10;
                    uVar10 = uVar10 >> 4 | uVar10;
                    uVar10 = uVar10 >> 8 | uVar10;
                    puVar24 = (ulong *)((uVar10 >> 0x10 | uVar10) + 1);
                    s->m = (size_t)puVar24;
                    pcVar13 = (char *)realloc(s->s,(size_t)puVar24);
                    pbVar25 = local_60;
                    if (pcVar13 != (char *)0x0) {
                      s->s = pcVar13;
                      sVar27 = s->l;
                      uVar10 = sVar27 + 1;
                      goto LAB_0011cfbb;
                    }
                  }
                  uVar21 = *(ushort *)((long)pbVar25->n + lVar29 * 2);
                }
                if (uVar21 < 2) {
                  sVar27 = s->l;
                  uVar10 = sVar27 + 1;
                  if (uVar10 < s->m) {
                    pcVar13 = s->s;
LAB_0011d129:
                    s->l = uVar10;
                    pcVar13[sVar27] = '.';
                    goto LAB_0011d130;
                  }
                  uVar10 = uVar10 >> 1 | uVar10;
                  uVar10 = uVar10 >> 2 | uVar10;
                  uVar10 = uVar10 >> 4 | uVar10;
                  uVar10 = uVar10 >> 8 | uVar10;
                  puVar24 = (ulong *)((uVar10 >> 0x10 | uVar10) + 1);
                  s->m = (size_t)puVar24;
                  pcVar13 = (char *)realloc(s->s,(size_t)puVar24);
                  pbVar25 = local_60;
                  if (pcVar13 != (char *)0x0) {
                    s->s = pcVar13;
                    sVar27 = s->l;
                    uVar10 = sVar27 + 1;
                    goto LAB_0011d129;
                  }
                }
                else {
                  sVar5 = (short)((uint)(int)(short)uVar21 >> 1);
                  uVar20 = sVar5 - 1;
                  uVar21 = -uVar20;
                  if (0 < (short)uVar20) {
                    uVar21 = uVar20;
                  }
                  uVar10 = 0;
                  uVar17 = (uint)uVar21;
                  do {
                    local_58[uVar10] = (char)uVar17 + (char)(uVar17 / 10) * -10 | 0x30;
                    uVar10 = uVar10 + 1;
                    bVar16 = 9 < uVar17;
                    uVar17 = uVar17 / 10;
                  } while (bVar16);
                  if (sVar5 < 1) {
                    uVar12 = uVar10 & 0xffffffff;
                    uVar10 = (ulong)((int)uVar10 + 1);
                    local_58[uVar12] = 0x2d;
                  }
                  uVar12 = s->l + (long)(int)uVar10 + 1;
                  if (s->m <= uVar12) {
                    uVar12 = uVar12 >> 1 | uVar12;
                    uVar12 = uVar12 >> 2 | uVar12;
                    uVar12 = uVar12 >> 4 | uVar12;
                    uVar12 = uVar12 >> 8 | uVar12;
                    puVar24 = (ulong *)((uVar12 >> 0x10 | uVar12) + 1);
                    s->m = (size_t)puVar24;
                    pcVar13 = (char *)realloc(s->s,(size_t)puVar24);
                    pbVar25 = local_60;
                    if (pcVar13 == (char *)0x0) goto LAB_0011d13b;
                    s->s = pcVar13;
                  }
                  iVar28 = (int)uVar10 + 1;
                  pbVar14 = local_58 + ((uVar10 & 0xffffffff) - 1);
                  do {
                    bVar7 = *pbVar14;
                    sVar27 = s->l;
                    puVar24 = (ulong *)s->s;
                    s->l = sVar27 + 1;
                    *(byte *)((long)puVar24 + sVar27) = bVar7;
                    iVar28 = iVar28 + -1;
                    pbVar14 = pbVar14 + -1;
                  } while (1 < iVar28);
LAB_0011d130:
                  s->s[s->l] = '\0';
                }
LAB_0011d13b:
                lVar29 = lVar29 + 1;
              } while (lVar29 < pbVar23[(long)puVar30].n);
              goto LAB_0011d38b;
            }
LAB_0011d427:
            sVar27 = s->l;
            uVar10 = sVar27 + 1;
            if (s->m <= uVar10) {
              uVar10 = uVar10 >> 1 | uVar10;
              uVar10 = uVar10 >> 2 | uVar10;
              uVar10 = uVar10 >> 4 | uVar10;
              uVar10 = uVar10 >> 8 | uVar10;
              puVar24 = (ulong *)((uVar10 >> 0x10 | uVar10) + 1);
              s->m = (size_t)puVar24;
              pcVar13 = (char *)realloc(s->s,(size_t)puVar24);
              if (pcVar13 == (char *)0x0) goto LAB_0011d49f;
              goto LAB_0011d480;
            }
            pcVar13 = s->s;
            goto LAB_0011d48b;
          }
          if (iVar28 == 1) {
            if (pbVar23[(long)puVar30].n < 1) goto LAB_0011d3b0;
            pbVar25 = (bcf_hdr_t *)
                      (pbVar23[(long)puVar30].p +
                      (long)(int)local_40 * (long)pbVar23[(long)puVar30].size);
            lVar29 = 0;
            local_60 = pbVar25;
            do {
              bVar7 = *(byte *)((long)pbVar25->n + lVar29);
              if (bVar7 == 0x81) goto LAB_0011d39b;
              if (lVar29 != 0) {
                cVar26 = "/|"[bVar7 & 1];
                sVar27 = s->l;
                uVar10 = sVar27 + 1;
                if (uVar10 < s->m) {
                  pcVar13 = s->s;
LAB_0011cd52:
                  s->l = uVar10;
                  pcVar13[sVar27] = cVar26;
                  s->s[s->l] = '\0';
                }
                else {
                  uVar10 = uVar10 >> 1 | uVar10;
                  uVar10 = uVar10 >> 2 | uVar10;
                  uVar10 = uVar10 >> 4 | uVar10;
                  uVar10 = uVar10 >> 8 | uVar10;
                  puVar24 = (ulong *)((uVar10 >> 0x10 | uVar10) + 1);
                  s->m = (size_t)puVar24;
                  pcVar13 = (char *)realloc(s->s,(size_t)puVar24);
                  pbVar25 = local_60;
                  if (pcVar13 != (char *)0x0) {
                    s->s = pcVar13;
                    sVar27 = s->l;
                    uVar10 = sVar27 + 1;
                    goto LAB_0011cd52;
                  }
                }
                bVar7 = *(byte *)((long)pbVar25->n + lVar29);
              }
              if (bVar7 < 2) {
                sVar27 = s->l;
                uVar10 = sVar27 + 1;
                if (uVar10 < s->m) {
                  pcVar13 = s->s;
LAB_0011ceba:
                  s->l = uVar10;
                  pcVar13[sVar27] = '.';
                  goto LAB_0011cec1;
                }
                uVar10 = uVar10 >> 1 | uVar10;
                uVar10 = uVar10 >> 2 | uVar10;
                uVar10 = uVar10 >> 4 | uVar10;
                uVar10 = uVar10 >> 8 | uVar10;
                puVar24 = (ulong *)((uVar10 >> 0x10 | uVar10) + 1);
                s->m = (size_t)puVar24;
                pcVar13 = (char *)realloc(s->s,(size_t)puVar24);
                pbVar25 = local_60;
                if (pcVar13 != (char *)0x0) {
                  s->s = pcVar13;
                  sVar27 = s->l;
                  uVar10 = sVar27 + 1;
                  goto LAB_0011ceba;
                }
              }
              else {
                bVar1 = ((char)bVar7 >> 1) - 1;
                bVar19 = (char)bVar1 >> 7;
                uVar10 = 0;
                uVar17 = (uint)(byte)((bVar1 ^ bVar19) - bVar19);
                do {
                  local_58[uVar10] = (char)uVar17 + (char)(uVar17 / 10) * -10 | 0x30;
                  uVar10 = uVar10 + 1;
                  bVar16 = 9 < uVar17;
                  uVar17 = uVar17 / 10;
                } while (bVar16);
                if ((char)bVar7 >> 1 < '\x01') {
                  uVar12 = uVar10 & 0xffffffff;
                  uVar10 = (ulong)((int)uVar10 + 1);
                  local_58[uVar12] = 0x2d;
                }
                uVar12 = s->l + (long)(int)uVar10 + 1;
                if (s->m <= uVar12) {
                  uVar12 = uVar12 >> 1 | uVar12;
                  uVar12 = uVar12 >> 2 | uVar12;
                  uVar12 = uVar12 >> 4 | uVar12;
                  uVar12 = uVar12 >> 8 | uVar12;
                  puVar24 = (ulong *)((uVar12 >> 0x10 | uVar12) + 1);
                  s->m = (size_t)puVar24;
                  pcVar13 = (char *)realloc(s->s,(size_t)puVar24);
                  pbVar25 = local_60;
                  if (pcVar13 == (char *)0x0) goto LAB_0011cecc;
                  s->s = pcVar13;
                }
                iVar28 = (int)uVar10 + 1;
                pbVar14 = local_58 + ((uVar10 & 0xffffffff) - 1);
                do {
                  bVar7 = *pbVar14;
                  sVar27 = s->l;
                  puVar24 = (ulong *)s->s;
                  s->l = sVar27 + 1;
                  *(byte *)((long)puVar24 + sVar27) = bVar7;
                  iVar28 = iVar28 + -1;
                  pbVar14 = pbVar14 + -1;
                } while (1 < iVar28);
LAB_0011cec1:
                s->s[s->l] = '\0';
              }
LAB_0011cecc:
              lVar29 = lVar29 + 1;
            } while (lVar29 < pbVar23[(long)puVar30].n);
LAB_0011d38b:
            bVar16 = false;
            pbVar23 = local_48;
            goto LAB_0011d4a1;
          }
          vcf_format_cold_3();
          uVar12 = extraout_RDX;
          goto switchD_0011c31e_caseD_4;
        }
        goto LAB_0011d4b6;
      }
    }
  }
LAB_0011d548:
  sVar27 = s->l;
  uVar10 = sVar27 + 1;
  if (uVar10 < s->m) {
    pcVar13 = s->s;
  }
  else {
    uVar10 = uVar10 >> 1 | uVar10;
    uVar10 = uVar10 >> 2 | uVar10;
    uVar10 = uVar10 >> 4 | uVar10;
    uVar10 = uVar10 >> 8 | uVar10;
    sVar9 = (uVar10 >> 0x10 | uVar10) + 1;
    s->m = sVar9;
    pcVar13 = (char *)realloc(s->s,sVar9);
    if (pcVar13 == (char *)0x0) {
      return 0;
    }
    s->s = pcVar13;
    sVar27 = s->l;
    uVar10 = sVar27 + 1;
  }
  s->l = uVar10;
  pcVar13[sVar27] = '\n';
  s->s[s->l] = '\0';
  return 0;
LAB_0011d39b:
  pbVar23 = local_48;
  if (lVar29 != 0) {
    bVar16 = false;
    goto LAB_0011d4a1;
  }
LAB_0011d3b0:
  sVar27 = s->l;
  uVar10 = sVar27 + 1;
  if (uVar10 < s->m) {
    pcVar13 = s->s;
LAB_0011d48b:
    s->l = uVar10;
    pcVar13[sVar27] = '.';
    s->s[s->l] = '\0';
  }
  else {
    uVar10 = uVar10 >> 1 | uVar10;
    uVar10 = uVar10 >> 2 | uVar10;
    uVar10 = uVar10 >> 4 | uVar10;
    uVar10 = uVar10 >> 8 | uVar10;
    puVar24 = (ulong *)((uVar10 >> 0x10 | uVar10) + 1);
    s->m = (size_t)puVar24;
    pcVar13 = (char *)realloc(s->s,(size_t)puVar24);
    if (pcVar13 != (char *)0x0) {
LAB_0011d480:
      s->s = pcVar13;
      sVar27 = s->l;
      uVar10 = sVar27 + 1;
      goto LAB_0011d48b;
    }
  }
LAB_0011d49f:
  bVar16 = false;
LAB_0011d4a1:
  puVar30 = (ulong *)((long)puVar30 + 1);
  if ((ulong *)(ulong)(byte)v->field_0x14 <= puVar30) goto code_r0x0011d4b2;
  goto LAB_0011cbe4;
code_r0x0011d4b2:
  if (bVar16) {
LAB_0011d4b6:
    sVar27 = s->l;
    uVar10 = sVar27 + 1;
    if (uVar10 < s->m) {
      pcVar13 = s->s;
    }
    else {
      uVar10 = uVar10 >> 1 | uVar10;
      uVar10 = uVar10 >> 2 | uVar10;
      uVar10 = uVar10 >> 4 | uVar10;
      uVar10 = uVar10 >> 8 | uVar10;
      puVar24 = (ulong *)((uVar10 >> 0x10 | uVar10) + 1);
      s->m = (size_t)puVar24;
      pcVar13 = (char *)realloc(s->s,(size_t)puVar24);
      if (pcVar13 == (char *)0x0) goto LAB_0011d52c;
      s->s = pcVar13;
      sVar27 = s->l;
      uVar10 = sVar27 + 1;
    }
    s->l = uVar10;
    pcVar13[sVar27] = '.';
    s->s[s->l] = '\0';
  }
LAB_0011d52c:
  uVar17 = (int)local_40 + 1;
  local_40 = (ulong)uVar17;
  if ((uint)((ulong)*(undefined8 *)&v->field_0x10 >> 0x28) <= uVar17) goto LAB_0011d548;
  goto LAB_0011cb4a;
switchD_0011c31e_caseD_4:
  uVar12 = uVar12 & 0xffffffff;
  vcf_format_cold_1();
LAB_0011d5db:
  vcf_format_cold_2();
  uVar10 = *puVar24;
  pvVar15 = (void *)puVar24[2];
  if (*(char *)((long)pvVar15 + (uVar10 - 1)) != '\n') {
    uVar18 = uVar10 + 1;
    if (puVar24[1] <= uVar18) {
      uVar18 = uVar18 >> 1 | uVar18;
      uVar18 = uVar18 >> 2 | uVar18;
      uVar18 = uVar18 >> 4 | uVar18;
      uVar18 = uVar18 >> 8 | uVar18;
      sVar9 = (uVar18 >> 0x10 | uVar18) + 1;
      puVar24[1] = sVar9;
      pvVar15 = realloc(pvVar15,sVar9);
      if (pvVar15 == (void *)0x0) goto LAB_0011d66b;
      puVar24[2] = (ulong)pvVar15;
      uVar10 = *puVar24;
      uVar18 = uVar10 + 1;
    }
    *puVar24 = uVar18;
    *(undefined1 *)((long)pvVar15 + uVar10) = 10;
    *(undefined1 *)(puVar24[2] + *puVar24) = 0;
  }
LAB_0011d66b:
  fp = *(BGZF **)(uVar12 + 0x38);
  uVar10 = *puVar24;
  pvVar15 = (void *)puVar24[2];
  if (*(int *)(uVar12 + 0x4c) == 0) {
    uVar18 = fp->uncompressed_address - (long)*(void **)&fp->block_length;
    uVar12 = uVar10;
    if (uVar18 < uVar10) {
      uVar12 = uVar18;
    }
    memcpy(*(void **)&fp->block_length,pvVar15,uVar12);
    *(ulong *)&fp->block_length = *(long *)&fp->block_length + uVar12;
    if (uVar18 < uVar10) {
      uVar12 = hwrite2((hFILE *)fp,pvVar15,uVar10,uVar12);
    }
  }
  else {
    uVar12 = bgzf_write(fp,pvVar15,uVar10);
  }
  return -(uint)((long)(int)uVar12 != *puVar24);
}

Assistant:

int vcf_format(const bcf_hdr_t *h, const bcf1_t *v, kstring_t *s)
{
    int i;
    bcf_unpack((bcf1_t*)v, BCF_UN_ALL);
    kputs(h->id[BCF_DT_CTG][v->rid].key, s); // CHROM
    kputc('\t', s); kputw(v->pos + 1, s); // POS
    kputc('\t', s); kputs(v->d.id ? v->d.id : ".", s); // ID
    kputc('\t', s); // REF
    if (v->n_allele > 0) kputs(v->d.allele[0], s);
    else kputc('.', s);
    kputc('\t', s); // ALT
    if (v->n_allele > 1) {
        for (i = 1; i < v->n_allele; ++i) {
            if (i > 1) kputc(',', s);
            kputs(v->d.allele[i], s);
        }
    } else kputc('.', s);
    kputc('\t', s); // QUAL
    if ( bcf_float_is_missing(v->qual) ) kputc('.', s); // QUAL
    else ksprintf(s, "%g", v->qual);
    kputc('\t', s); // FILTER
    if (v->d.n_flt) {
        for (i = 0; i < v->d.n_flt; ++i) {
            if (i) kputc(';', s);
            kputs(h->id[BCF_DT_ID][v->d.flt[i]].key, s);
        }
    } else kputc('.', s);
    kputc('\t', s); // INFO
    if (v->n_info) {
        int first = 1;
        for (i = 0; i < v->n_info; ++i) {
            bcf_info_t *z = &v->d.info[i];
            if ( !z->vptr ) continue;
            if ( !first ) kputc(';', s); first = 0;
            kputs(h->id[BCF_DT_ID][z->key].key, s);
            if (z->len <= 0) continue;
            kputc('=', s);
            if (z->len == 1) 
            {
                switch (z->type) 
                {
                    case BCF_BT_INT8:  if ( z->v1.i==bcf_int8_missing ) kputc('.', s); else kputw(z->v1.i, s); break;
                    case BCF_BT_INT16: if ( z->v1.i==bcf_int16_missing ) kputc('.', s); else kputw(z->v1.i, s); break;
                    case BCF_BT_INT32: if ( z->v1.i==bcf_int32_missing ) kputc('.', s); else kputw(z->v1.i, s); break;
                    case BCF_BT_FLOAT: if ( bcf_float_is_missing(z->v1.f) ) kputc('.', s); else ksprintf(s, "%g", z->v1.f); break;
                    case BCF_BT_CHAR:  kputc(z->v1.i, s); break;
                    default: fprintf(stderr,"todo: type %d\n", z->type); exit(1); break;
                }
            }
            else bcf_fmt_array(s, z->len, z->type, z->vptr);
        }
        if ( first ) kputc('.', s);
    } else kputc('.', s);
    // FORMAT and individual information
    if (v->n_sample)
    {
        int i,j;
        if ( v->n_fmt)
        {
            int gt_i = -1;
            bcf_fmt_t *fmt = v->d.fmt;
            int first = 1;
            for (i = 0; i < (int)v->n_fmt; ++i) {
                if ( !fmt[i].p ) continue;
                kputc(!first ? ':' : '\t', s); first = 0;
                if ( fmt[i].id<0 ) //!bcf_hdr_idinfo_exists(h,BCF_HL_FMT,fmt[i].id) )
                {
                    fprintf(stderr, "[E::%s] invalid BCF, the FORMAT tag id=%d not present in the header.\n", __func__, fmt[i].id);
                    abort();
                }
                kputs(h->id[BCF_DT_ID][fmt[i].id].key, s);
                if (strcmp(h->id[BCF_DT_ID][fmt[i].id].key, "GT") == 0) gt_i = i;
            }
            if ( first ) kputs("\t.", s);
            for (j = 0; j < v->n_sample; ++j) {
                kputc('\t', s);
                first = 1;
                for (i = 0; i < (int)v->n_fmt; ++i) {
                    bcf_fmt_t *f = &fmt[i];
                    if ( !f->p ) continue;
                    if (!first) kputc(':', s); first = 0;
                    if (gt_i == i)
                        bcf_format_gt(f,j,s);
                    else
                        bcf_fmt_array(s, f->n, f->type, f->p + j * f->size);
                }
                if ( first ) kputc('.', s);
            }
        }
        else
            for (j=0; j<=v->n_sample; j++)
                kputs("\t.", s);
    }
    kputc('\n', s);
    return 0;
}